

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_(run_for_at_least_argument_t<system_clock,_repeater<now<system_clock>_>_>)>
 nonius::detail::
 run_for_at_least<std::chrono::_V2::system_clock,nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>>>
           (parameters *params,Duration<std::chrono::_V2::system_clock> how_long,int seed,
           repeater<nonius::now<std::chrono::_V2::system_clock>_> *fun)

{
  bool bVar1;
  undefined8 in_RAX;
  undefined8 *puVar2;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_&(int_&)>
  TVar3;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_(run_for_at_least_argument_t<system_clock,_repeater<now<system_clock>_>_>)>
  TVar4;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (seed < 0x40000000) {
    do {
      uStack_28 = CONCAT44(seed,(undefined4)uStack_28);
      TVar3 = measure<std::chrono::_V2::system_clock,nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>>&,int&>
                        (fun,(int *)((long)&uStack_28 + 4));
      TVar4.elapsed = TVar3.elapsed.__r;
      if (how_long.__r <= TVar4.elapsed.__r) {
        TVar4._8_8_ = (ulong)(uint)seed << 0x20;
        return TVar4;
      }
      bVar1 = seed < 0x20000000;
      seed = seed * 2;
    } while (bVar1);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_0020c2b0;
  __cxa_throw(puVar2,&optimized_away_error::typeinfo,std::exception::~exception);
}

Assistant:

TimingOf<Clock, Fun(run_for_at_least_argument_t<Clock, Fun>)> run_for_at_least(const parameters& params, Duration<Clock> how_long, int seed, Fun&& fun) {
            auto iters = seed;
            while(iters < (1 << 30)) {
                auto&& timing = measure_one<Clock>(fun, iters, params, detail::is_callable<Fun(chronometer)>());

                if(timing.elapsed >= how_long) {
                    return { timing.elapsed, std::move(timing.result), iters };
                }
                iters *= 2;
            }
            throw optimized_away_error{};
        }